

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS
ref_gather_cell(REF_NODE ref_node,REF_CELL ref_cell,REF_BOOL faceid_insted_of_c2n,REF_BOOL always_id
               ,REF_BOOL swap_endian,REF_BOOL sixty_four_bit,REF_BOOL select_faceid,REF_INT faceid,
               REF_BOOL pad,FILE *file)

{
  uint uVar1;
  int iVar2;
  REF_STATUS RVar3;
  uint uVar4;
  size_t sVar5;
  void *pvVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  int iVar13;
  int iVar14;
  REF_MPI pRVar15;
  undefined4 in_stack_00000014;
  REF_INT part;
  REF_INT nodes [27];
  int local_1e8;
  uint local_1e4;
  REF_BOOL local_1e0;
  REF_BOOL local_1dc;
  ulong local_1d8;
  int local_1cc;
  void *local_1c8;
  long local_1c0;
  REF_MPI local_1b8;
  long local_1b0;
  REF_BOOL local_1a8;
  undefined4 local_1a4;
  void *local_1a0;
  void *local_198;
  long local_190;
  ulong auStack_188 [4];
  undefined8 uStack_168;
  REF_INT local_a8 [30];
  
  local_1b8 = ref_node->ref_mpi;
  uVar1 = ref_cell->node_per;
  local_1b0 = (long)(int)uVar1;
  uVar10 = (ulong)uVar1;
  local_1c0 = (long)ref_cell->size_per;
  iVar13 = ref_cell->max;
  if (local_1b8->id == 0) {
    local_1c8 = (void *)CONCAT44(local_1c8._4_4_,sixty_four_bit);
    local_1dc = always_id;
    local_1a8 = faceid_insted_of_c2n;
    if (0 < iVar13) {
      iVar14 = 0;
      local_1e0 = swap_endian;
      do {
        RVar3 = ref_cell_nodes(ref_cell,iVar14,local_a8);
        if (RVar3 == 0) {
          uVar4 = ref_cell_part(ref_cell,ref_node,iVar14,&local_1cc);
          if (uVar4 != 0) {
            pcVar12 = "part";
            uVar8 = 0x79a;
            goto LAB_0013788b;
          }
          if (local_1b8->id == local_1cc) {
            if (0 < (int)local_1b0) {
              uVar9 = 0;
              do {
                iVar13 = local_a8[uVar9];
                if (((long)iVar13 < 0) || (ref_node->max <= iVar13)) {
                  uVar7 = 0;
                }
                else {
                  uVar7 = 0;
                  if (-1 < ref_node->global[iVar13]) {
                    uVar7 = ref_node->global[iVar13] + 1;
                  }
                }
                auStack_188[uVar9] = uVar7;
                uVar9 = uVar9 + 1;
              } while (uVar10 != uVar9);
            }
            auStack_188[local_1b0] = 0;
            if ((int)uVar1 < (int)local_1c0) {
              auStack_188[local_1b0] = (long)local_a8[local_1b0];
            }
            uVar7 = auStack_188[2];
            uVar9 = auStack_188[1];
            if ((local_1dc != 0) && (ref_cell->type == REF_CELL_PYR)) {
              auStack_188[1] = auStack_188[3];
              auStack_188[2] = uStack_168;
              auStack_188[3] = uVar9;
              uStack_168 = uVar7;
            }
            if (local_1a8 == 0) {
              if (0 < (int)local_1b0) {
                uVar9 = 0;
                do {
                  uVar7 = auStack_188[uVar9];
                  if ((int)local_1c8 == 0) {
                    uVar4 = (uint)uVar7;
                    local_1e4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                                uVar4 << 0x18;
                    if (local_1e0 == 0) {
                      local_1e4 = uVar4;
                    }
                    sVar5 = fwrite(&local_1e4,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                    if (sVar5 != 1) {
                      pcVar12 = "int cel node";
                      uVar8 = 0x7c7;
                      goto LAB_001379df;
                    }
                  }
                  else {
                    local_1d8 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                                (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                                (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                                (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
                    if (local_1e0 == 0) {
                      local_1d8 = uVar7;
                    }
                    sVar5 = fwrite(&local_1d8,8,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                    if (sVar5 != 1) {
                      pcVar12 = "long cel node";
                      uVar8 = 0x7c2;
                      goto LAB_001379df;
                    }
                  }
                  uVar9 = uVar9 + 1;
                } while (uVar10 != uVar9);
              }
              if (select_faceid != 0) {
                local_1e8 = 0;
                sVar5 = fwrite(&local_1e8,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                if (sVar5 != 1) {
                  pcVar12 = "zero pad";
                  uVar8 = 0x7cd;
LAB_001379df:
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,uVar8,"ref_gather_cell",pcVar12,1,sVar5);
                  return 1;
                }
              }
              if (local_1dc != 0) {
                uVar9 = auStack_188[local_1b0];
                if ((int)local_1c8 == 0) {
                  uVar4 = (uint)uVar9;
                  local_1e4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                              uVar4 << 0x18;
                  if (local_1e0 == 0) {
                    local_1e4 = uVar4;
                  }
                  sVar5 = fwrite(&local_1e4,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                  if (sVar5 != 1) {
                    pcVar12 = "int id";
                    uVar8 = 0x7d8;
                    goto LAB_001379df;
                  }
                }
                else {
                  local_1d8 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                              (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                              (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                              (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
                  if (local_1e0 == 0) {
                    local_1d8 = uVar9;
                  }
                  sVar5 = fwrite(&local_1d8,8,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                  if (sVar5 != 1) {
                    pcVar12 = "long id";
                    uVar8 = 0x7d4;
                    goto LAB_001379df;
                  }
                }
              }
            }
            else {
              uVar9 = auStack_188[local_1b0];
              if ((int)local_1c8 == 0) {
                uVar4 = (uint)uVar9;
                local_1e4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                            uVar4 << 0x18;
                if (local_1e0 == 0) {
                  local_1e4 = uVar4;
                }
                sVar5 = fwrite(&local_1e4,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                if (sVar5 != 1) {
                  pcVar12 = "int id";
                  uVar8 = 0x7ba;
                  goto LAB_001379df;
                }
              }
              else {
                local_1d8 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                            (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                            (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                            (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
                if (local_1e0 == 0) {
                  local_1d8 = uVar9;
                }
                sVar5 = fwrite(&local_1d8,8,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                if (sVar5 != 1) {
                  pcVar12 = "long id";
                  uVar8 = 0x7b6;
                  goto LAB_001379df;
                }
              }
            }
          }
        }
        iVar14 = iVar14 + 1;
        iVar13 = ref_cell->max;
      } while (iVar14 < iVar13);
      swap_endian = local_1e0;
      if (local_1b8->id != 0) goto LAB_00136d1c;
    }
    if (local_1b8->n < 2) {
      return 0;
    }
    local_190 = local_1c0 * 8;
    local_1e0 = 1;
    pRVar15 = local_1b8;
    iVar13 = (int)local_1c8;
    do {
      uVar4 = ref_mpi_gather_recv(pRVar15,&local_1e8,1,1,local_1e0);
      if (uVar4 != 0) {
        pcVar12 = "recv ncell";
        uVar8 = 0x7e3;
        goto LAB_0013788b;
      }
      if (0 < local_1e8) {
        uVar4 = local_1e8 * (int)local_1c0;
        if ((int)uVar4 < 0) {
          uVar8 = 0x7e5;
          goto LAB_001375c1;
        }
        pvVar6 = malloc((ulong)uVar4 << 3);
        if (pvVar6 == (void *)0x0) {
          uVar8 = 0x7e5;
          goto LAB_00137676;
        }
        local_1a0 = pvVar6;
        uVar4 = ref_mpi_gather_recv(pRVar15,pvVar6,uVar4,2,local_1e0);
        if (uVar4 != 0) {
          pcVar12 = "recv c2n";
          uVar8 = 0x7e8;
          goto LAB_0013788b;
        }
        if (0 < local_1e8) {
          local_198 = (void *)((long)local_1a0 + local_1b0 * 8);
          lVar11 = 0;
          pvVar6 = local_1a0;
          do {
            if (0 < (int)local_1b0) {
              uVar9 = 0;
              do {
                auStack_188[uVar9] = *(long *)((long)pvVar6 + uVar9 * 8) + 1;
                uVar9 = uVar9 + 1;
              } while (uVar10 != uVar9);
            }
            auStack_188[local_1b0] = 0;
            if ((int)uVar1 < (int)local_1c0) {
              auStack_188[local_1b0] = *(ulong *)((long)local_198 + lVar11 * local_1c0 * 8);
            }
            uVar7 = auStack_188[2];
            uVar9 = auStack_188[1];
            if ((local_1dc != 0) && (ref_cell->type == REF_CELL_PYR)) {
              auStack_188[1] = auStack_188[3];
              auStack_188[2] = uStack_168;
              auStack_188[3] = uVar9;
              uStack_168 = uVar7;
            }
            if (local_1a8 == 0) {
              if (0 < (int)uVar1) {
                uVar9 = 0;
                do {
                  uVar7 = auStack_188[uVar9];
                  if ((int)local_1c8 == 0) {
                    uVar4 = (uint)uVar7;
                    local_1e4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                                uVar4 << 0x18;
                    if (swap_endian == 0) {
                      local_1e4 = uVar4;
                    }
                    sVar5 = fwrite(&local_1e4,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                    if (sVar5 != 1) {
                      pcVar12 = "int cel node";
                      uVar8 = 0x816;
                      goto LAB_001379df;
                    }
                  }
                  else {
                    local_1d8 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                                (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                                (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                                (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
                    if (swap_endian == 0) {
                      local_1d8 = uVar7;
                    }
                    sVar5 = fwrite(&local_1d8,8,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                    if (sVar5 != 1) {
                      pcVar12 = "long cel node";
                      uVar8 = 0x811;
                      goto LAB_001379df;
                    }
                  }
                  uVar9 = uVar9 + 1;
                } while (uVar10 != uVar9);
              }
              iVar13 = (int)local_1c8;
              if (select_faceid != 0) {
                local_1a4 = 0;
                sVar5 = fwrite(&local_1a4,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                if (sVar5 != 1) {
                  pcVar12 = "zero pad";
                  uVar8 = 0x81c;
                  goto LAB_001379df;
                }
              }
              if (local_1dc != 0) {
                uVar9 = auStack_188[local_1b0];
                if (iVar13 == 0) {
                  uVar4 = (uint)uVar9;
                  local_1e4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                              uVar4 << 0x18;
                  if (swap_endian == 0) {
                    local_1e4 = uVar4;
                  }
                  sVar5 = fwrite(&local_1e4,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                  if (sVar5 != 1) {
                    pcVar12 = "int id";
                    uVar8 = 0x827;
                    goto LAB_001379df;
                  }
                }
                else {
                  local_1d8 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                              (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                              (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                              (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
                  if (swap_endian == 0) {
                    local_1d8 = uVar9;
                  }
                  sVar5 = fwrite(&local_1d8,8,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                  if (sVar5 != 1) {
                    pcVar12 = "long id";
                    uVar8 = 0x823;
                    goto LAB_001379df;
                  }
                }
              }
            }
            else {
              uVar9 = auStack_188[local_1b0];
              if (iVar13 == 0) {
                uVar4 = (uint)uVar9;
                local_1e4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                            uVar4 << 0x18;
                if (swap_endian == 0) {
                  local_1e4 = uVar4;
                }
                sVar5 = fwrite(&local_1e4,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                if (sVar5 != 1) {
                  pcVar12 = "int id";
                  uVar8 = 0x809;
                  goto LAB_001379df;
                }
              }
              else {
                local_1d8 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                            (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                            (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                            (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
                if (swap_endian == 0) {
                  local_1d8 = uVar9;
                }
                sVar5 = fwrite(&local_1d8,8,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                if (sVar5 != 1) {
                  pcVar12 = "long id";
                  uVar8 = 0x805;
                  goto LAB_001379df;
                }
              }
            }
            lVar11 = lVar11 + 1;
            pvVar6 = (void *)((long)pvVar6 + local_190);
          } while (lVar11 < local_1e8);
        }
        free(local_1a0);
        pRVar15 = local_1b8;
      }
      local_1e0 = local_1e0 + 1;
      if (pRVar15->n <= local_1e0) {
        return 0;
      }
    } while( true );
  }
LAB_00136d1c:
  local_1e8 = 0;
  if (0 < iVar13) {
    iVar13 = 0;
    do {
      RVar3 = ref_cell_nodes(ref_cell,iVar13,local_a8);
      if (RVar3 == 0) {
        uVar4 = ref_cell_part(ref_cell,ref_node,iVar13,&local_1cc);
        if (uVar4 != 0) {
          pcVar12 = "part";
          uVar8 = 0x832;
          goto LAB_0013788b;
        }
        if (local_1b8->id == local_1cc) {
          local_1e8 = local_1e8 + 1;
        }
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < ref_cell->max);
  }
  pRVar15 = local_1b8;
  uVar4 = ref_mpi_gather_send(local_1b8,&local_1e8,1,1);
  if (uVar4 == 0) {
    if (local_1e8 < 1) {
      return 0;
    }
    if (local_1e8 * (int)local_1c0 < 0) {
      uVar8 = 0x839;
LAB_001375c1:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar8,"ref_gather_cell","malloc c2n of REF_GLOB negative");
      return 1;
    }
    pvVar6 = malloc((ulong)(uint)(local_1e8 * (int)local_1c0) << 3);
    if (pvVar6 == (void *)0x0) {
      uVar8 = 0x839;
LAB_00137676:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar8,"ref_gather_cell","malloc c2n of REF_GLOB NULL");
      return 2;
    }
    local_1e8 = 0;
    if (0 < ref_cell->max) {
      iVar13 = 0;
      local_1c8 = pvVar6;
      do {
        RVar3 = ref_cell_nodes(ref_cell,iVar13,local_a8);
        if (RVar3 == 0) {
          uVar4 = ref_cell_part(ref_cell,ref_node,iVar13,&local_1cc);
          if (uVar4 != 0) {
            pcVar12 = "part";
            uVar8 = 0x83c;
            goto LAB_0013788b;
          }
          if (local_1b8->id == local_1cc) {
            iVar14 = (int)local_1c0;
            if (0 < (int)uVar1) {
              uVar9 = 0;
              do {
                iVar2 = local_a8[uVar9];
                lVar11 = -1;
                if (((-1 < (long)iVar2) && (iVar2 < ref_node->max)) &&
                   (lVar11 = ref_node->global[iVar2], lVar11 < 0)) {
                  lVar11 = -1;
                }
                *(long *)((long)local_1c8 + uVar9 * 8 + (long)(local_1e8 * iVar14) * 8) = lVar11;
                uVar9 = uVar9 + 1;
              } while (uVar10 != uVar9);
            }
            if ((int)local_1b0 < iVar14) {
              lVar11 = local_1b0;
              do {
                *(long *)((long)local_1c8 + lVar11 * 8 + (long)(local_1e8 * iVar14) * 8) =
                     (long)local_a8[lVar11];
                lVar11 = lVar11 + 1;
              } while (local_1c0 != lVar11);
            }
            local_1e8 = local_1e8 + 1;
          }
        }
        iVar13 = iVar13 + 1;
        pvVar6 = local_1c8;
        pRVar15 = local_1b8;
      } while (iVar13 < ref_cell->max);
    }
    uVar4 = ref_mpi_gather_send(pRVar15,pvVar6,(int)local_1c0 * local_1e8,2);
    if (uVar4 == 0) {
      free(pvVar6);
      return 0;
    }
    pcVar12 = "send c2n";
    uVar8 = 0x848;
  }
  else {
    pcVar12 = "send ncell";
    uVar8 = 0x837;
  }
LAB_0013788b:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar8,
         "ref_gather_cell",(ulong)uVar4,pcVar12);
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_cell(
    REF_NODE ref_node, REF_CELL ref_cell, REF_BOOL faceid_insted_of_c2n,
    REF_BOOL always_id, REF_BOOL swap_endian, REF_BOOL sixty_four_bit,
    REF_BOOL select_faceid, REF_INT faceid, REF_BOOL pad, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT cell, node, part;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_LONG globals[REF_CELL_MAX_SIZE_PER + 1];
  REF_INT node_per = ref_cell_node_per(ref_cell);
  REF_INT size_per = ref_cell_size_per(ref_cell);
  REF_INT ncell;
  REF_GLOB *c2n;
  REF_INT c2n_int;
  REF_LONG c2n_long;
  REF_INT proc;

  if (ref_mpi_once(ref_mpi)) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part &&
          (!select_faceid || nodes[ref_cell_node_per(ref_cell)] == faceid)) {
        for (node = 0; node < node_per; node++)
          globals[node] = ref_node_global(ref_node, nodes[node]) + 1;
        globals[node_per] = REF_EXPORT_MESHB_3D_ID;
        if (size_per > node_per) globals[node_per] = nodes[node_per];

        if (always_id && REF_CELL_PYR == ref_cell_type(ref_cell)) {
          REF_LONG n0, n1, n2, n3, n4;
          /* convention: square basis is 0-1-2-3
             (oriented counter clockwise like trias) and top vertex is 4 */
          n0 = globals[0];
          n1 = globals[3];
          n2 = globals[4];
          n3 = globals[1];
          n4 = globals[2];
          globals[0] = n0;
          globals[1] = n1;
          globals[2] = n2;
          globals[3] = n3;
          globals[4] = n4;
        }

        if (faceid_insted_of_c2n) {
          if (sixty_four_bit) {
            c2n_long = globals[node_per];
            if (swap_endian) SWAP_LONG(c2n_long);
            REIS(1, fwrite(&(c2n_long), sizeof(REF_LONG), 1, file), "long id");
          } else {
            c2n_int = (REF_INT)globals[node_per];
            if (swap_endian) SWAP_INT(c2n_int);
            REIS(1, fwrite(&(c2n_int), sizeof(REF_INT), 1, file), "int id");
          }
        } else {
          for (node = 0; node < node_per; node++) {
            if (sixty_four_bit) {
              c2n_long = globals[node];
              if (swap_endian) SWAP_LONG(c2n_long);
              REIS(1, fwrite(&c2n_long, sizeof(REF_LONG), 1, file),
                   "long cel node");
            } else {
              c2n_int = (REF_INT)globals[node];
              if (swap_endian) SWAP_INT(c2n_int);
              REIS(1, fwrite(&c2n_int, sizeof(REF_INT), 1, file),
                   "int cel node");
            }
          }
          if (pad) {
            REF_INT zero = 0;
            if (swap_endian) SWAP_INT(zero);
            REIS(1, fwrite(&(zero), sizeof(REF_INT), 1, file), "zero pad");
          }
          if (always_id) {
            if (sixty_four_bit) {
              c2n_long = globals[node_per];
              if (swap_endian) SWAP_LONG(c2n_long);
              REIS(1, fwrite(&(c2n_long), sizeof(REF_LONG), 1, file),
                   "long id");
            } else {
              c2n_int = (REF_INT)globals[node_per];
              if (swap_endian) SWAP_INT(c2n_int);
              REIS(1, fwrite(&(c2n_int), sizeof(REF_INT), 1, file), "int id");
            }
          }
        }
      }
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    each_ref_mpi_worker(ref_mpi, proc) {
      RSS(ref_mpi_gather_recv(ref_mpi, &ncell, 1, REF_INT_TYPE, proc),
          "recv ncell");
      if (ncell > 0) {
        ref_malloc(c2n, ncell * size_per, REF_GLOB);
        RSS(ref_mpi_gather_recv(ref_mpi, c2n, ncell * size_per, REF_GLOB_TYPE,
                                proc),
            "recv c2n");
        for (cell = 0; cell < ncell; cell++) {
          for (node = 0; node < node_per; node++)
            globals[node] = c2n[node + size_per * cell] + 1;
          globals[node_per] = REF_EXPORT_MESHB_3D_ID;
          if (size_per > node_per)
            globals[node_per] = c2n[node_per + size_per * cell];

          if (always_id && REF_CELL_PYR == ref_cell_type(ref_cell)) {
            REF_LONG n0, n1, n2, n3, n4;
            /* convention: square basis is 0-1-2-3
               (oriented counter clockwise like trias) and top vertex is 4 */
            n0 = globals[0];
            n1 = globals[3];
            n2 = globals[4];
            n3 = globals[1];
            n4 = globals[2];
            globals[0] = n0;
            globals[1] = n1;
            globals[2] = n2;
            globals[3] = n3;
            globals[4] = n4;
          }

          if (faceid_insted_of_c2n) {
            if (sixty_four_bit) {
              c2n_long = globals[node_per];
              if (swap_endian) SWAP_LONG(c2n_long);
              REIS(1, fwrite(&(c2n_long), sizeof(REF_LONG), 1, file),
                   "long id");
            } else {
              c2n_int = (REF_INT)globals[node_per];
              if (swap_endian) SWAP_INT(c2n_int);
              REIS(1, fwrite(&(c2n_int), sizeof(REF_INT), 1, file), "int id");
            }
          } else {
            for (node = 0; node < node_per; node++) {
              if (sixty_four_bit) {
                c2n_long = globals[node];
                if (swap_endian) SWAP_LONG(c2n_long);
                REIS(1, fwrite(&c2n_long, sizeof(REF_LONG), 1, file),
                     "long cel node");
              } else {
                c2n_int = (REF_INT)globals[node];
                if (swap_endian) SWAP_INT(c2n_int);
                REIS(1, fwrite(&c2n_int, sizeof(REF_INT), 1, file),
                     "int cel node");
              }
            }
            if (pad) {
              REF_INT zero = 0;
              if (swap_endian) SWAP_INT(zero);
              REIS(1, fwrite(&(zero), sizeof(REF_INT), 1, file), "zero pad");
            }
            if (always_id) {
              if (sixty_four_bit) {
                c2n_long = globals[node_per];
                if (swap_endian) SWAP_LONG(c2n_long);
                REIS(1, fwrite(&(c2n_long), sizeof(REF_LONG), 1, file),
                     "long id");
              } else {
                c2n_int = (REF_INT)globals[node_per];
                if (swap_endian) SWAP_INT(c2n_int);
                REIS(1, fwrite(&(c2n_int), sizeof(REF_INT), 1, file), "int id");
              }
            }
          }
        }
        ref_free(c2n);
      }
    }
  } else {
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part &&
          (!select_faceid || nodes[ref_cell_node_per(ref_cell)] == faceid))
        ncell++;
    }
    RSS(ref_mpi_gather_send(ref_mpi, &ncell, 1, REF_INT_TYPE), "send ncell");
    if (ncell > 0) {
      ref_malloc(c2n, ncell * size_per, REF_GLOB);
      ncell = 0;
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
        if (ref_mpi_rank(ref_mpi) == part &&
            (!select_faceid || nodes[ref_cell_node_per(ref_cell)] == faceid)) {
          for (node = 0; node < node_per; node++)
            c2n[node + size_per * ncell] =
                ref_node_global(ref_node, nodes[node]);
          for (node = node_per; node < size_per; node++)
            c2n[node + size_per * ncell] = (REF_GLOB)nodes[node];
          ncell++;
        }
      }
      RSS(ref_mpi_gather_send(ref_mpi, c2n, ncell * size_per, REF_GLOB_TYPE),
          "send c2n");
      ref_free(c2n);
    }
  }

  return REF_SUCCESS;
}